

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

float Abc_SclComputeAreaClass(SC_Cell *pRepr)

{
  int iVar1;
  int iVar2;
  SC_Cell *pSVar3;
  SC_Cell *pCell;
  bool bVar4;
  float fVar5;
  
  fVar5 = 0.0;
  iVar2 = 0;
  iVar1 = 0;
  for (pSVar3 = pRepr; bVar4 = iVar2 == 0, iVar2 = iVar2 + -1, pSVar3 != pRepr || bVar4;
      pSVar3 = pSVar3->pNext) {
    if (pSVar3->fSkip == 0) {
      fVar5 = fVar5 + pSVar3->area;
      iVar1 = iVar1 + 1;
    }
  }
  iVar2 = 1;
  if (1 < iVar1) {
    iVar2 = iVar1;
  }
  return fVar5 / (float)iVar2;
}

Assistant:

float Abc_SclComputeAreaClass( SC_Cell * pRepr )
{
    SC_Cell * pCell;
    float Area = 0;
    int i, Count = 0;
    SC_RingForEachCell( pRepr, pCell, i )
    {
        if ( pCell->fSkip ) 
            continue;
        Area += pCell->area;
        Count++;
    }
    return Area / Abc_MaxInt(1, Count);
}